

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
::evaluate(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
           *this,ExecutionContext *execCtx)

{
  pointer pSVar1;
  int iVar2;
  undefined4 extraout_var;
  long extraout_RDX;
  int iVar3;
  int compNdx;
  long lVar4;
  long lVar5;
  float fVar6;
  
  (*this->m_child->_vptr_Expression[4])();
  iVar2 = (*this->m_child->_vptr_Expression[5])();
  if (0 < (this->m_inValueRange).m_type.m_numElements) {
    pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar3 = 0;
    lVar5 = 0;
    do {
      VariableType::getElementType((VariableType *)CONCAT44(extraout_var,iVar2));
      VariableType::getElementType(&(this->m_inValueRange).m_type);
      lVar4 = 0;
      do {
        fVar6 = *(float *)(extraout_RDX + (long)iVar3 * 4 + lVar4 * 4);
        if (fVar6 < 0.0) {
          fVar6 = sqrtf(fVar6);
        }
        else {
          fVar6 = SQRT(fVar6);
        }
        pSVar1[iVar3 + lVar4].floatVal = 1.0 / fVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
      lVar5 = lVar5 + 1;
      iVar3 = iVar3 + 0x40;
    } while (lVar5 < (this->m_inValueRange).m_type.m_numElements);
  }
  return;
}

Assistant:

void UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::evaluate (ExecutionContext& execCtx)
{
	m_child->evaluate(execCtx);

	ExecConstValueAccess	srcValue	= m_child->getValue();
	ExecValueAccess			dstValue	= m_value.getValue(m_inValueRange.getType());

	for (int elemNdx = 0; elemNdx < m_inValueRange.getType().getNumElements(); elemNdx++)
	{
		ExecConstValueAccess	srcComp		= srcValue.component(elemNdx);
		ExecValueAccess			dstComp		= dstValue.component(elemNdx);

		for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			dstComp.asFloat(compNdx) = Evaluate()(srcComp.asFloat(compNdx));
	}
}